

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::numparse::impl::AffixMatcher::toString
          (UnicodeString *__return_storage_ptr__,AffixMatcher *this)

{
  char16_t *text;
  UnicodeString local_2b0;
  UnicodeString local_270;
  UnicodeString local_230;
  UnicodeString local_1f0;
  UnicodeString local_1a0;
  UnicodeString local_160;
  UnicodeString local_120;
  UnicodeString local_e0;
  UnicodeString local_a0;
  UnicodeString local_60;
  byte local_19;
  AffixMatcher *pAStack_18;
  bool isNegative;
  AffixMatcher *this_local;
  
  local_19 = (byte)this->fFlags & 1;
  pAStack_18 = this;
  this_local = (AffixMatcher *)__return_storage_ptr__;
  UnicodeString::UnicodeString(&local_160,L"<Affix");
  text = L" ";
  if ((local_19 & 1) != 0) {
    text = L":negative ";
  }
  UnicodeString::UnicodeString(&local_1a0,text);
  operator+(&local_120,&local_160,&local_1a0);
  if (this->fPrefix == (AffixPatternMatcher *)0x0) {
    UnicodeString::UnicodeString(&local_1f0,L"null");
  }
  else {
    AffixPatternMatcher::getPattern(&local_1f0,this->fPrefix);
  }
  operator+(&local_e0,&local_120,&local_1f0);
  UnicodeString::UnicodeString(&local_230,L"#");
  operator+(&local_a0,&local_e0,&local_230);
  if (this->fSuffix == (AffixPatternMatcher *)0x0) {
    UnicodeString::UnicodeString(&local_270,L"null");
  }
  else {
    AffixPatternMatcher::getPattern(&local_270,this->fSuffix);
  }
  operator+(&local_60,&local_a0,&local_270);
  UnicodeString::UnicodeString(&local_2b0,L">");
  operator+(__return_storage_ptr__,&local_60,&local_2b0);
  UnicodeString::~UnicodeString(&local_2b0);
  UnicodeString::~UnicodeString(&local_60);
  UnicodeString::~UnicodeString(&local_270);
  UnicodeString::~UnicodeString(&local_a0);
  UnicodeString::~UnicodeString(&local_230);
  UnicodeString::~UnicodeString(&local_e0);
  UnicodeString::~UnicodeString(&local_1f0);
  UnicodeString::~UnicodeString(&local_120);
  UnicodeString::~UnicodeString(&local_1a0);
  UnicodeString::~UnicodeString(&local_160);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString AffixMatcher::toString() const {
    bool isNegative = 0 != (fFlags & FLAG_NEGATIVE);
    return UnicodeString(u"<Affix") + (isNegative ? u":negative " : u" ") +
           (fPrefix ? fPrefix->getPattern() : u"null") + u"#" +
           (fSuffix ? fSuffix->getPattern() : u"null") + u">";

}